

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O2

void __thiscall URI::buildString(URI *this)

{
  bool bVar1;
  string str;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  if (this->mModified != false) {
    local_30 = local_20;
    local_28 = 0;
    local_20[0] = 0;
    if ((this->mScheme)._M_string_length != 0) {
      std::__cxx11::string::append((string *)&local_30);
      std::__cxx11::string::append((char *)&local_30);
    }
    if ((this->mAuthority)._M_string_length != 0) {
      bVar1 = std::operator!=(&this->mScheme,"mailto");
      if (bVar1) {
        bVar1 = std::operator!=(&this->mScheme,"news");
        if (bVar1) {
          std::__cxx11::string::append((char *)&local_30);
        }
      }
      std::__cxx11::string::append((string *)&local_30);
    }
    std::__cxx11::string::append((string *)&local_30);
    buildQuery(this);
    if ((this->mQueryString)._M_string_length != 0) {
      std::__cxx11::string::append((char *)&local_30);
      std::__cxx11::string::append((string *)&local_30);
    }
    if ((this->mFragment)._M_string_length != 0) {
      std::__cxx11::string::append((char *)&local_30);
      std::__cxx11::string::append((string *)&local_30);
    }
    std::__cxx11::string::_M_assign((string *)&this->mFullString);
    this->mModified = false;
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void URI::buildString() const
{
	if ( mModified == false )
		return;
	
	string str;
	
	if ( not mScheme.empty() )
	{
		str += mScheme;
		str += ":";
	}
	
	if ( not mAuthority.empty() )
	{
		// These URI's do not add a //
		if ( mScheme != "mailto" && mScheme != "news" )
			str += "//";
		
		str += mAuthority;
	}
		
	str += mPath;
	
	buildQuery();
	
	if ( not mQueryString.empty() )
	{
		str += "?";
		str += mQueryString;
	}
	
	if ( not mFragment.empty() )
	{
		str += "#";
		str += mFragment;
	}
	
	mFullString = str;
	mModified = false;
}